

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O1

string * __thiscall
flatbuffers::BfbsNamer::Denamespace<reflection::Enum_const*>
          (string *__return_storage_ptr__,BfbsNamer *this,Enum *t,string *namespace_prefix,
          char delimiter)

{
  ushort uVar1;
  allocator<char> local_49;
  string local_48;
  
  if (*(ushort *)(t + -(long)*(int *)t) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(t + (4 - (long)*(int *)t));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)(t + (ulong)*(uint *)(t + uVar1) + (ulong)uVar1 + 4),
             &local_49);
  Namer::Denamespace(__return_storage_ptr__,&this->super_Namer,&local_48,namespace_prefix,delimiter)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(T t, std::string &namespace_prefix,
                          const char delimiter = '.') const {
    return Namer::Denamespace(t->name()->c_str(), namespace_prefix, delimiter);
  }